

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaRex.c
# Opt level: O3

void Gia_ManAutomWalkOne(Gia_Man_t *p,int nSteps,Vec_Wrd_t *vStates,Vec_Int_t *vCounts,
                        Vec_Wrd_t *vTemp,word Init)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  word wVar4;
  long lVar5;
  Vec_Int_t *pVVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  uint uVar10;
  word Cur;
  ulong uVar11;
  int iVar12;
  word pNext [64];
  word local_238 [65];
  
  if (0 < nSteps) {
    Cur = 0;
    iVar7 = 0;
    do {
      wVar4 = Gia_ManAutomStep(p,Cur,local_238,vTemp);
      iVar3 = p->nRegs;
      pVVar6 = p->vCis;
      iVar2 = pVVar6->nSize;
      if (iVar2 <= iVar3) {
LAB_007b6dd1:
        if (iVar3 < iVar2) {
          lVar5 = 0;
          do {
            if ((long)(wVar4 << ((byte)lVar5 & 0x3f)) < 0) {
              putchar((int)lVar5 + 0x61);
              putchar(0x21);
              iVar3 = p->nRegs;
              pVVar6 = p->vCis;
            }
            lVar5 = lVar5 + 1;
          } while (lVar5 < (long)pVVar6->nSize - (long)iVar3);
        }
        break;
      }
      uVar10 = 0xffffffff;
      iVar12 = 1000000000;
      uVar11 = 0;
      uVar9 = 0xffffffff;
      do {
        if (local_238[uVar11] != Init) {
          iVar3 = 0;
          uVar1 = 0xffffffff;
          if (0 < (long)vStates->nSize) {
            lVar5 = 0;
            do {
              if (vStates->pArray[lVar5] == local_238[uVar11]) {
                uVar1 = (uint)lVar5;
                if (vCounts->nSize <= (int)uVar1) {
                  __assert_fail("i >= 0 && i < p->nSize",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                                ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
                }
                iVar3 = vCounts->pArray[lVar5];
                break;
              }
              lVar5 = lVar5 + 1;
            } while (vStates->nSize != lVar5);
          }
          if ((iVar3 < iVar12) ||
             ((iVar3 != 0 && iVar12 != 1000000000 &&
              (iVar2 = rand(), (float)iVar2 * 4.656613e-10 < (float)iVar12 / (float)iVar3)))) {
            uVar9 = uVar11 & 0xffffffff;
            iVar12 = iVar3;
            uVar10 = uVar1;
          }
          iVar8 = (int)uVar9;
          if (iVar12 == 0) {
            if (uVar10 != 0xffffffff) goto LAB_007b6d74;
            goto LAB_007b6d46;
          }
          iVar3 = p->nRegs;
          pVVar6 = p->vCis;
        }
        iVar8 = (int)uVar9;
        uVar11 = uVar11 + 1;
        iVar2 = pVVar6->nSize;
      } while ((long)uVar11 < (long)(iVar2 - iVar3));
      if (iVar12 == 1000000000) goto LAB_007b6dd1;
      if (999999999 < iVar12) {
        __assert_fail("CountMin < ABC_INFINITY",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRex.c"
                      ,0x1c5,
                      "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                     );
      }
      if (uVar10 == 0xffffffff) {
        if (iVar12 != 0) {
          __assert_fail("CountMin == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaRex.c"
                        ,0x1c8,
                        "void Gia_ManAutomWalkOne(Gia_Man_t *, int, Vec_Wrd_t *, Vec_Int_t *, Vec_Wrd_t *, word)"
                       );
        }
LAB_007b6d46:
        uVar10 = vCounts->nSize;
        Vec_IntPush(vCounts,0);
        Vec_WrdPush(vStates,local_238[iVar8]);
      }
LAB_007b6d74:
      if (((int)uVar10 < 0) || (vCounts->nSize <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      vCounts->pArray[uVar10] = vCounts->pArray[uVar10] + 1;
      Cur = local_238[iVar8];
      putchar(iVar8 + 0x61);
      if ((wVar4 >> ((ulong)(byte)(0x3f - (char)iVar8) & 0x3f) & 1) != 0) {
        putchar(0x21);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != nSteps);
  }
  putchar(10);
  return;
}

Assistant:

void Gia_ManAutomWalkOne( Gia_Man_t * p, int nSteps, Vec_Wrd_t * vStates, Vec_Int_t * vCounts, Vec_Wrd_t * vTemp, word Init )
{
    word iState = 0, Output, pNext[64]; 
    int i, k, kMin, Index, IndexMin;
    int Count, CountMin; 
    for ( i = 0; i < nSteps; i++ )
    {
        Output = Gia_ManAutomStep( p, iState, pNext, vTemp );
        // check visited states
        kMin = -1;
        IndexMin = -1;
        CountMin = ABC_INFINITY;  
        for ( k = 0; k < Gia_ManPiNum(p); k++ )
        {
            if ( pNext[k] == Init )
                continue;
            Index = Vec_WrdFind( vStates, pNext[k] );
            Count = Index == -1 ? 0 : Vec_IntEntry( vCounts, Index );
            if ( CountMin > Count || (CountMin != ABC_INFINITY && Count && ((float)CountMin / Count) > (float)rand()/RAND_MAX ) )
            {
                CountMin = Count;
                IndexMin = Index;
                kMin = k;
            }
            if ( CountMin == 0 )
                break;
        }
        // choose the best state
        if ( CountMin == ABC_INFINITY )
        {
            for ( k = 0; k < Gia_ManPiNum(p); k++ )
                if ( (Output >> (63-k)) & 1 )
                {
                    printf( "%c", 'a' + k );
                    printf( "!" );
                }            
            break;
        }
        assert( CountMin < ABC_INFINITY );
        if ( IndexMin == -1 )
        {
            assert( CountMin == 0 );
            IndexMin = Vec_IntSize(vCounts);
            Vec_IntPush( vCounts, 0 );
            Vec_WrdPush( vStates, pNext[kMin] );
        }
        Vec_IntAddToEntry( vCounts, IndexMin, 1 );
        iState = pNext[kMin];
//Extra_PrintBinary( stdout, (unsigned *)&iState, 64 ); printf( "\n" );
        // print the transition
        printf( "%c", 'a' + kMin );
        if ( (Output >> (63-kMin)) & 1 )
            printf( "!" );
    }
    printf( "\n" );
}